

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O1

string * GetAutogenTargetDir_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  cmMakefile *this;
  char *pcVar1;
  string local_38;
  
  this = target->Target->Makefile;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  cmMakefile::GetCMakeInstance(this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetAutogenTargetName_abi_cxx11_(&local_38,target);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAutogenTargetDir(
    cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();
  std::string targetDir = makefile->GetCurrentBinaryDirectory();
  targetDir += makefile->GetCMakeInstance()->GetCMakeFilesDirectory();
  targetDir += "/";
  targetDir += GetAutogenTargetName(target);
  targetDir += ".dir/";
  return targetDir;
}